

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_fc801a::CloseButton::paintEvent(CloseButton *this,QPaintEvent *param_1)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ButtonPosition position;
  QTabBar *this_00;
  QStyle *pQVar5;
  QWidget *pQVar6;
  int index;
  long in_FS_OFFSET;
  QPainter p;
  QStyleOption opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom(&opt,(QWidget *)this);
  opt._8_8_ = opt._8_8_ | 0x1000;
  if ((((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 3) == 2) &&
      (bVar4 = QAbstractButton::isChecked(&this->super_QAbstractButton), !bVar4)) &&
     (bVar4 = QAbstractButton::isDown(&this->super_QAbstractButton), !bVar4)) {
    opt._8_8_ = opt._8_8_ | 2;
  }
  bVar4 = QAbstractButton::isChecked(&this->super_QAbstractButton);
  if (bVar4) {
    opt._8_8_ = opt._8_8_ | 0x20;
  }
  bVar4 = QAbstractButton::isDown(&this->super_QAbstractButton);
  if (bVar4) {
    opt._8_8_ = opt._8_8_ | 4;
  }
  this_00 = QtPrivate::qobject_cast_helper<QTabBar_const*,QObject>
                      (*(QObject **)
                        (*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10));
  if (this_00 != (QTabBar *)0x0) {
    lVar3 = *(long *)&(this_00->super_QWidget).field_0x8;
    iVar1 = *(int *)(lVar3 + 700);
    if ((long)iVar1 < 0) {
      index = -1;
    }
    else {
      index = -1;
      if ((ulong)(long)iVar1 < *(ulong *)(lVar3 + 0x2e8)) {
        index = iVar1;
      }
    }
    pQVar5 = QWidget::style((QWidget *)this);
    position = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x5c,0,this_00,0);
    pQVar6 = QTabBar::tabButton(this_00,index,position);
    if (pQVar6 == (QWidget *)this) {
      opt._8_8_ = opt._8_8_ | 0x8000;
    }
  }
  pQVar5 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar5 + 0xb0))(pQVar5,0x2f,&opt,&p,this);
  QStyleOption::~QStyleOption(&opt);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CloseButton::paintEvent(QPaintEvent *)
{
    QPainter p(this);
    QStyleOption opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;
    if (isEnabled() && underMouse() && !isChecked() && !isDown())
        opt.state |= QStyle::State_Raised;
    if (isChecked())
        opt.state |= QStyle::State_On;
    if (isDown())
        opt.state |= QStyle::State_Sunken;

    if (const QTabBar *tb = qobject_cast<const QTabBar *>(parent())) {
        int index = tb->currentIndex();
        QTabBar::ButtonPosition position = (QTabBar::ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, tb);
        if (tb->tabButton(index, position) == this)
            opt.state |= QStyle::State_Selected;
    }

    style()->drawPrimitive(QStyle::PE_IndicatorTabClose, &opt, &p, this);
}